

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::LDA_IM(CPU *this)

{
  uint8_t uVar1;
  CPU *this_local;
  
  this->cycles = 2;
  uVar1 = GetByte(this);
  this->A = uVar1;
  (this->field_6).ps = (this->field_6).ps & 0xfd | (this->A == '\0') << 1;
  (this->field_6).ps =
       (this->field_6).ps & 0x7f | ((this->A & 0x80) != 0 && -1 < (int)(this->A & 0x80)) << 7;
  return;
}

Assistant:

void CPU::LDA_IM()
{
    cycles = 2;
    A = GetByte();
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
}